

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O3

int Lodtalk::CompiledMethod::stObjectAt(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar3;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  if ((((uVar2 & 1) != 0) && (uVar3 = CONCAT44(extraout_var_01,uVar2) >> 1, 0 < (long)uVar3)) &&
     (uVar3 <= (ulong)(*(uint *)(CONCAT44(extraout_var_00,iVar1) + 8) >> 1 & 0xffff) + 1)) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])
                      (interpreter,*(undefined8 *)(CONCAT44(extraout_var_00,iVar1) + uVar3 * 8));
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int CompiledMethod::stObjectAt(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto selfOop = interpreter->getReceiver();
    auto self = reinterpret_cast<CompiledMethod*> (selfOop.pointer);

    auto indexOop = interpreter->getTemporary(0);
    if(!indexOop.isSmallInteger())
        return interpreter->primitiveFailed();

    auto index = indexOop.decodeSmallInteger();
    if(index < 1 || index > (SmallIntegerValue)self->getLiteralCount() + 1)
        return interpreter->primitiveFailed();

    return interpreter->returnOop(reinterpret_cast<Oop*> (self->getFirstFieldPointer())[index - 1]);
}